

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rHasNullFlag,int isRowid)

{
  byte bVar1;
  ExprList *pEVar2;
  SrcList *pExpr_00;
  KeyInfo *pKVar3;
  u8 uVar4;
  undefined1 uVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Vdbe *p;
  Expr *pEVar10;
  Select *pSVar11;
  CollSeq *pCVar12;
  Expr *pEVar13;
  uint p2;
  char *pcVar14;
  Op *pOVar15;
  int op;
  SrcList **ppSVar16;
  ulong uVar17;
  ExprList_item *pEVar18;
  uint N;
  int iVar19;
  int iValToIns;
  uint local_98;
  char local_91;
  Expr *local_90;
  int local_84;
  Expr *local_80;
  KeyInfo *local_78;
  ulong local_70;
  int local_64;
  Walker local_60;
  
  local_70 = CONCAT44(local_70._4_4_,isRowid);
  p = sqlite3GetVdbe(pParse);
  if (p == (Vdbe *)0x0) {
    return 0;
  }
  local_98 = 0xffffffff;
  if ((pExpr->flags & 0x20) == 0) {
    local_98 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
  }
  local_64 = rHasNullFlag;
  if (pExpr->op != '1') {
    pSVar11 = (pExpr->x).pSelect;
    pcVar14 = "CORRELATED ";
    if (-1 < (int)local_98) {
      pcVar14 = "";
    }
    iVar19 = 1;
    sqlite3VdbeExplain(pParse,'\x01',"%sSCALAR SUBQUERY",pcVar14);
    uVar4 = pExpr->op;
    if (uVar4 == '\x7f') {
      iVar19 = pSVar11->pEList->nExpr;
    }
    local_60.pParse._4_4_ = pParse->nMem + 1;
    iVar7 = pParse->nMem + iVar19;
    local_60.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
    local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    pParse->nMem = iVar7;
    if (uVar4 == '\x7f') {
      local_60.xExprCallback =
           (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(iVar19,local_60.pParse._4_4_);
      sqlite3VdbeAddOp3(p,0x49,0,local_60.pParse._4_4_,iVar7);
      uVar5 = 10;
    }
    else {
      sqlite3VdbeAddOp3(p,0x46,0,local_60.pParse._4_4_,0);
      uVar5 = 3;
    }
    local_60.pParse._0_4_ = CONCAT31(local_60.pParse._1_3_,uVar5);
    pEVar13 = sqlite3ExprAlloc(pParse->db,0x8f,sqlite3IntTokens + 1,0);
    pEVar10 = pSVar11->pLimit;
    if (pEVar10 == (Expr *)0x0) {
      pEVar10 = sqlite3PExpr(pParse,0x89,pEVar13,(Expr *)0x0);
      pSVar11->pLimit = pEVar10;
    }
    else {
      if (pEVar10->pLeft != (Expr *)0x0) {
        sqlite3ExprDeleteNN(pParse->db,pEVar10->pLeft);
        pEVar10 = pSVar11->pLimit;
      }
      pEVar10->pLeft = pEVar13;
    }
    pSVar11->iLimit = 0;
    iVar7 = sqlite3Select(pParse,pSVar11,(SelectDest *)&local_60);
    iVar19 = local_60.pParse._4_4_;
    if (iVar7 != 0) {
      return 0;
    }
    goto LAB_00154e50;
  }
  pEVar10 = pExpr->pLeft;
  uVar4 = pEVar10->op;
  if (uVar4 == 0xa4) {
    uVar4 = pEVar10->op2;
  }
  if (uVar4 == '\x7f') {
    pSVar11 = (pEVar10->x).pSelect;
LAB_00154a04:
    N = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar11->pEList)->pList->nExpr;
  }
  else {
    N = 1;
    if (uVar4 == 0xa5) {
      pSVar11 = (Select *)&pEVar10->x;
      goto LAB_00154a04;
    }
  }
  iVar19 = pParse->nTab;
  pParse->nTab = iVar19 + 1;
  pExpr->iTable = iVar19;
  local_78 = (KeyInfo *)0x0;
  iVar7 = (int)local_70;
  p2 = 0;
  if ((int)local_70 == 0) {
    p2 = N;
  }
  local_84 = sqlite3VdbeAddOp3(p,0x71,iVar19,p2,0);
  if (iVar7 == 0) {
    local_78 = sqlite3KeyInfoAlloc(pParse->db,N,1);
  }
  pSVar11 = (Select *)(pExpr->x).pList;
  local_90 = pExpr;
  if ((pExpr->flags & 0x800) == 0) {
    if (pSVar11 != (Select *)0x0) {
      cVar6 = sqlite3ExprAffinity(pEVar10);
      pKVar3 = local_78;
      local_91 = 'A';
      if (cVar6 != '\0') {
        local_91 = cVar6;
      }
      if (local_78 != (KeyInfo *)0x0) {
        pCVar12 = sqlite3ExprCollSeq(pParse,local_90->pLeft);
        pKVar3->aColl[0] = pCVar12;
      }
      uVar4 = pParse->nTempReg;
      if (uVar4 == '\0') {
        iVar19 = pParse->nMem + 1;
        local_80 = (Expr *)CONCAT44(local_80._4_4_,iVar19);
        pParse->nMem = iVar19;
LAB_00154bce:
        iVar19 = pParse->nMem + 1;
        pParse->nMem = iVar19;
      }
      else {
        bVar1 = uVar4 - 1;
        pParse->nTempReg = bVar1;
        local_80 = (Expr *)CONCAT44(local_80._4_4_,pParse->aTempReg[bVar1]);
        if (bVar1 == 0) goto LAB_00154bce;
        pParse->nTempReg = uVar4 - 2;
        iVar19 = pParse->aTempReg[(byte)(uVar4 - 2)];
      }
      if ((int)local_70 != 0) {
        iVar7 = sqlite3VdbeAddOp3(p,0x4b,0,iVar19,0);
        sqlite3VdbeChangeP4(p,iVar7,"",-1);
      }
      if (0 < *(int *)&pSVar11->pEList) {
        ppSVar16 = (SrcList **)&pSVar11->op;
        iVar7 = *(int *)&pSVar11->pEList + 1;
        do {
          pExpr_00 = *ppSVar16;
          if (-1 < (int)local_98) {
            local_60.eCode = '\x01';
            local_60.xExprCallback = exprNodeIsConstant;
            local_60.xSelectCallback = sqlite3SelectWalkFail;
            local_60.u.n = 0;
            if ((pExpr_00 != (SrcList *)0x0) &&
               (walkExpr(&local_60,(Expr *)pExpr_00), local_60.eCode == '\0')) {
              sqlite3VdbeChangeToNoop(p,local_98);
              local_98 = 0xffffffff;
            }
          }
          if ((int)local_70 == 0) {
            iVar8 = sqlite3ExprCodeTarget(pParse,(Expr *)pExpr_00,(int)local_80);
            iVar9 = sqlite3VdbeAddOp3(p,0x66,iVar8,1,iVar19);
            sqlite3VdbeChangeP4(p,iVar9,&local_91,1);
            iVar8 = sqlite3VdbeAddOp3(p,0x85,local_90->iTable,iVar19,iVar8);
            if (p->db->mallocFailed == '\0') {
              pOVar15 = p->aOp;
              pOVar15[iVar8].p4type = -3;
              pOVar15[iVar8].p4.i = 1;
            }
          }
          else {
            iVar8 = sqlite3ExprIsInteger((Expr *)pExpr_00,(int *)&local_60);
            if (iVar8 == 0) {
              iVar9 = sqlite3ExprCodeTarget(pParse,(Expr *)pExpr_00,(int)local_80);
              sqlite3VdbeAddOp3(p,0xf,iVar9,p->nOp + 2,0);
              iVar8 = local_90->iTable;
              op = 0x7a;
            }
            else {
              iVar8 = local_90->iTable;
              op = 0x7b;
              iVar9 = (int)local_60.pParse;
            }
            sqlite3VdbeAddOp3(p,op,iVar8,iVar19,iVar9);
          }
          ppSVar16 = ppSVar16 + 4;
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
      }
      if ((int)local_80 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = (int)local_80;
        }
      }
      if (iVar19 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar19;
        }
      }
    }
  }
  else {
    pEVar2 = pSVar11->pEList;
    pcVar14 = "CORRELATED ";
    if (-1 < (int)local_98) {
      pcVar14 = "";
    }
    local_80 = pEVar10;
    sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY",pcVar14);
    if (pEVar2->nExpr == N) {
      local_60.pParse._4_4_ = local_90->iTable;
      local_60.pParse._0_4_ = CONCAT31(local_60.pParse._1_3_,0xb);
      local_60.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
      local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)exprINAffinity(pParse,local_90);
      pSVar11->iLimit = 0;
      iVar19 = sqlite3Select(pParse,pSVar11,(SelectDest *)&local_60);
      if (iVar19 != 0) {
        if (local_60.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
          sqlite3DbFreeNN(pParse->db,local_60.xSelectCallback);
        }
        if ((local_78 != (KeyInfo *)0x0) &&
           (local_78->nRef = local_78->nRef - 1, local_78->nRef == 0)) {
          sqlite3DbFreeNN(local_78->db,local_78);
        }
        return 0;
      }
      if (local_60.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
        sqlite3DbFreeNN(pParse->db,local_60.xSelectCallback);
      }
      pKVar3 = local_78;
      pEVar10 = local_80;
      if (0 < (int)N) {
        pEVar18 = pEVar2->a;
        uVar17 = 0;
        local_70 = (ulong)N;
        do {
          pEVar13 = sqlite3VectorFieldSubexpr(pEVar10,(int)uVar17);
          pCVar12 = sqlite3BinaryCompareCollSeq(pParse,pEVar13,pEVar18->pExpr);
          pKVar3->aColl[uVar17] = pCVar12;
          uVar17 = uVar17 + 1;
          pEVar18 = pEVar18 + 1;
        } while (local_70 != uVar17);
      }
    }
  }
  pExpr = local_90;
  iVar19 = 0;
  if (local_78 != (KeyInfo *)0x0) {
    sqlite3VdbeChangeP4(p,local_84,(char *)local_78,-9);
  }
LAB_00154e50:
  if (local_64 != 0) {
    sqlite3SetHasNullFlag(p,pExpr->iTable,local_64);
  }
  if (-1 < (int)local_98) {
    if (p->db->mallocFailed == '\0') {
      pOVar15 = p->aOp + local_98;
    }
    else {
      pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar15->p2 = p->nOp;
  }
  return iVar19;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rHasNullFlag,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int jmpIfDynamic = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;

  /* The evaluation of the IN/EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    jmpIfDynamic = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  switch( pExpr->op ){
    case TK_IN: {
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */
      KeyInfo *pKeyInfo = 0;      /* Key information */
      int nVal;                   /* Size of vector pLeft */
      
      nVal = sqlite3ExprVectorSize(pLeft);
      assert( !isRowid || nVal==1 );

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with index keys representing the results from the 
      ** SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, 
          pExpr->iTable, (isRowid?0:nVal));
      pKeyInfo = isRowid ? 0 : sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        Select *pSelect = pExpr->x.pSelect;
        ExprList *pEList = pSelect->pEList;

        ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "
        ));
        assert( !isRowid );
        /* If the LHS and RHS of the IN operator do not match, that
        ** error will have been caught long before we reach this point. */
        if( ALWAYS(pEList->nExpr==nVal) ){
          SelectDest dest;
          int i;
          sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
          dest.zAffSdst = exprINAffinity(pParse, pExpr);
          pSelect->iLimit = 0;
          testcase( pSelect->selFlags & SF_Distinct );
          testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
          if( sqlite3Select(pParse, pSelect, &dest) ){
            sqlite3DbFree(pParse->db, dest.zAffSdst);
            sqlite3KeyInfoUnref(pKeyInfo);
            return 0;
          }
          sqlite3DbFree(pParse->db, dest.zAffSdst);
          assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
          assert( pEList!=0 );
          assert( pEList->nExpr>0 );
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          for(i=0; i<nVal; i++){
            Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
            pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
                pParse, p, pEList->a[i].pExpr
            );
          }
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        char affinity;            /* Affinity of the LHS of the IN */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;
        affinity = sqlite3ExprAffinity(pLeft);
        if( !affinity ){
          affinity = SQLITE_AFF_BLOB;
        }
        if( pKeyInfo ){
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        }

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        if( isRowid ) sqlite3VdbeAddOp4(v, OP_Blob, 0, r2, 0, "", P4_STATIC);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( jmpIfDynamic>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, jmpIfDynamic);
            jmpIfDynamic = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              VdbeCoverage(v);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pExpr->iTable, r2, r3, 1);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( pKeyInfo ){
        sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* Case 3:    (SELECT ... FROM ...)
      **     or:    EXISTS(SELECT ... FROM ...)
      **
      ** For a SELECT, generate code to put the values for all columns of
      ** the first row into an array of registers and return the index of
      ** the first register.
      **
      ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
      ** into a register and return that register number.
      **
      ** In both cases, the query is augmented with "LIMIT 1".  Any 
      ** preexisting limit is discarded in place of the new LIMIT 1.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECT result */
      int nReg;                             /* Registers to allocate */
      Expr *pLimit;                         /* New limit expression */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );

      pSel = pExpr->x.pSelect;
      ExplainQueryPlan((pParse, 1, "%sSCALAR SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "));
      nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
      sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
      pParse->nMem += nReg;
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        dest.iSdst = dest.iSDParm;
        dest.nSdst = nReg;
        sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,&sqlite3IntTokens[1], 0);
      if( pSel->pLimit ){
        sqlite3ExprDelete(pParse->db, pSel->pLimit->pLeft);
        pSel->pLimit->pLeft = pLimit;
      }else{
        pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
      }
      pSel->iLimit = 0;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetVVAProperty(pExpr, EP_NoReduce);
      break;
    }
  }

  if( rHasNullFlag ){
    sqlite3SetHasNullFlag(v, pExpr->iTable, rHasNullFlag);
  }

  if( jmpIfDynamic>=0 ){
    sqlite3VdbeJumpHere(v, jmpIfDynamic);
  }

  return rReg;
}